

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlParserInputGrow(xmlParserInputPtr in,int len)

{
  xmlBufPtr buf;
  int iVar1;
  size_t sVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  
  iVar1 = -1;
  if ((((-1 < len && in != (xmlParserInputPtr)0x0) && (in->buf != (xmlParserInputBufferPtr)0x0)) &&
      (pxVar4 = in->base, pxVar4 != (xmlChar *)0x0)) &&
     ((pxVar3 = in->cur, pxVar3 != (xmlChar *)0x0 && (buf = in->buf->buffer, buf != (xmlBufPtr)0x0))
     )) {
    sVar2 = xmlBufUse(buf);
    iVar1 = 0;
    if ((sVar2 <= ((int)pxVar3 - (int)pxVar4) + 0xfa) &&
       (iVar1 = 0, in->buf->readcallback != (xmlInputReadCallback)0x0)) {
      iVar1 = xmlParserInputBufferGrow(in->buf,len);
      pxVar3 = xmlBufContent(in->buf->buffer);
      pxVar4 = in->base;
      if (pxVar4 != pxVar3) {
        in->base = pxVar3;
        in->cur = pxVar3 + ((long)in->cur - (long)pxVar4);
      }
      pxVar4 = xmlBufEnd(in->buf->buffer);
      in->end = pxVar4;
    }
  }
  return iVar1;
}

Assistant:

int
xmlParserInputGrow(xmlParserInputPtr in, int len) {
    int ret;
    size_t indx;
    const xmlChar *content;

    if ((in == NULL) || (len < 0)) return(-1);
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext, "Grow\n");
#endif
    if (in->buf == NULL) return(-1);
    if (in->base == NULL) return(-1);
    if (in->cur == NULL) return(-1);
    if (in->buf->buffer == NULL) return(-1);

    CHECK_BUFFER(in);

    indx = in->cur - in->base;
    if (xmlBufUse(in->buf->buffer) > (unsigned int) indx + INPUT_CHUNK) {

	CHECK_BUFFER(in);

        return(0);
    }
    if (in->buf->readcallback != NULL) {
	ret = xmlParserInputBufferGrow(in->buf, len);
    } else
        return(0);

    /*
     * NOTE : in->base may be a "dangling" i.e. freed pointer in this
     *        block, but we use it really as an integer to do some
     *        pointer arithmetic. Insure will raise it as a bug but in
     *        that specific case, that's not !
     */

    content = xmlBufContent(in->buf->buffer);
    if (in->base != content) {
        /*
	 * the buffer has been reallocated
	 */
	indx = in->cur - in->base;
	in->base = content;
	in->cur = &content[indx];
    }
    in->end = xmlBufEnd(in->buf->buffer);

    CHECK_BUFFER(in);

    return(ret);
}